

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2021d5::PerAEADTest_TruncatedTags_Test::TestBody
          (PerAEADTest_TruncatedTags_Test *this)

{
  int iVar1;
  ParamType *pPVar2;
  EVP_AEAD *pEVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  AssertHelper *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  pointer pcVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  pointer *__ptr;
  uint8_t kSentinel;
  uint8_t plaintext [1];
  uint8_t plaintext2 [17];
  size_t ciphertext_len;
  size_t plaintext2_len;
  size_t nonce_len;
  uint8_t nonce [32];
  size_t overhead_used;
  size_t key_len;
  uint8_t ciphertext [128];
  size_t expected_overhead;
  uint8_t key [80];
  ScopedEVP_AEAD_CTX ctx;
  uchar local_40a;
  undefined1 local_409;
  undefined1 auStack_408 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  undefined1 local_3f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_3d0;
  undefined1 local_3c8;
  Bytes local_3b8;
  AssertHelper local_3a8;
  ulong local_3a0;
  ulong local_398;
  char *local_390;
  AssertHelper local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  unsigned_long local_368;
  size_t local_360;
  string local_358;
  char local_338 [104];
  unsigned_long local_2d0;
  uint8_t local_2c8 [88];
  undefined1 local_270 [8];
  evp_aead_ctx_st_state local_268;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  if ((pPVar2->flags & 2) == 0) {
    return;
  }
  local_2c8[0x40] = '\0';
  local_2c8[0x41] = '\0';
  local_2c8[0x42] = '\0';
  local_2c8[0x43] = '\0';
  local_2c8[0x44] = '\0';
  local_2c8[0x45] = '\0';
  local_2c8[0x46] = '\0';
  local_2c8[0x47] = '\0';
  local_2c8[0x48] = '\0';
  local_2c8[0x49] = '\0';
  local_2c8[0x4a] = '\0';
  local_2c8[0x4b] = '\0';
  local_2c8[0x4c] = '\0';
  local_2c8[0x4d] = '\0';
  local_2c8[0x4e] = '\0';
  local_2c8[0x4f] = '\0';
  local_2c8[0x30] = '\0';
  local_2c8[0x31] = '\0';
  local_2c8[0x32] = '\0';
  local_2c8[0x33] = '\0';
  local_2c8[0x34] = '\0';
  local_2c8[0x35] = '\0';
  local_2c8[0x36] = '\0';
  local_2c8[0x37] = '\0';
  local_2c8[0x38] = '\0';
  local_2c8[0x39] = '\0';
  local_2c8[0x3a] = '\0';
  local_2c8[0x3b] = '\0';
  local_2c8[0x3c] = '\0';
  local_2c8[0x3d] = '\0';
  local_2c8[0x3e] = '\0';
  local_2c8[0x3f] = '\0';
  local_2c8[0x20] = '\0';
  local_2c8[0x21] = '\0';
  local_2c8[0x22] = '\0';
  local_2c8[0x23] = '\0';
  local_2c8[0x24] = '\0';
  local_2c8[0x25] = '\0';
  local_2c8[0x26] = '\0';
  local_2c8[0x27] = '\0';
  local_2c8[0x28] = '\0';
  local_2c8[0x29] = '\0';
  local_2c8[0x2a] = '\0';
  local_2c8[0x2b] = '\0';
  local_2c8[0x2c] = '\0';
  local_2c8[0x2d] = '\0';
  local_2c8[0x2e] = '\0';
  local_2c8[0x2f] = '\0';
  local_2c8[0x10] = '\0';
  local_2c8[0x11] = '\0';
  local_2c8[0x12] = '\0';
  local_2c8[0x13] = '\0';
  local_2c8[0x14] = '\0';
  local_2c8[0x15] = '\0';
  local_2c8[0x16] = '\0';
  local_2c8[0x17] = '\0';
  local_2c8[0x18] = '\0';
  local_2c8[0x19] = '\0';
  local_2c8[0x1a] = '\0';
  local_2c8[0x1b] = '\0';
  local_2c8[0x1c] = '\0';
  local_2c8[0x1d] = '\0';
  local_2c8[0x1e] = '\0';
  local_2c8[0x1f] = '\0';
  local_2c8[0] = '\0';
  local_2c8[1] = '\0';
  local_2c8[2] = '\0';
  local_2c8[3] = '\0';
  local_2c8[4] = '\0';
  local_2c8[5] = '\0';
  local_2c8[6] = '\0';
  local_2c8[7] = '\0';
  local_2c8[8] = '\0';
  local_2c8[9] = '\0';
  local_2c8[10] = '\0';
  local_2c8[0xb] = '\0';
  local_2c8[0xc] = '\0';
  local_2c8[0xd] = '\0';
  local_2c8[0xe] = '\0';
  local_2c8[0xf] = '\0';
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  pEVar3 = (*pPVar2->func)();
  local_360 = EVP_AEAD_key_length(pEVar3);
  local_358._M_dataplus._M_p = (pointer)0x50;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)local_270,"sizeof(key)","key_len",(unsigned_long *)&local_358,&local_360);
  if (local_270[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_358);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268.alignment ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_268.alignment;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x1e3,pcVar8);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_358);
    this_00 = &local_388;
LAB_0022d883:
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((long *)local_358._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_358._M_dataplus._M_p + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268.alignment !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_270 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_268.alignment);
    }
    return;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268.alignment !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_270 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_268.alignment);
  }
  local_378 = 0;
  uStack_370 = 0;
  local_388.data_ = (AssertHelperData *)0x0;
  uStack_380 = 0;
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  pEVar3 = (*pPVar2->func)();
  local_390 = (char *)EVP_AEAD_nonce_length(pEVar3);
  local_358._M_dataplus._M_p = (pointer)0x20;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)local_270,"sizeof(nonce)","nonce_len",(unsigned_long *)&local_358,
             (unsigned_long *)&local_390);
  if (local_270[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_358);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268.alignment ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_268.alignment;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x1e8,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)&local_358);
    this_00 = (AssertHelper *)local_3f8;
    goto LAB_0022d883;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268.alignment !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_270 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_268.alignment);
  }
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  uVar10 = pPVar2->flags >> 8 & 0xf;
  uVar6 = (ulong)(uVar10 + (uVar10 == 0));
  EVP_AEAD_CTX_zero((EVP_AEAD_CTX *)local_270);
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  pEVar3 = (*pPVar2->func)();
  pcVar8 = (char *)0x0;
  iVar1 = EVP_AEAD_CTX_init((EVP_AEAD_CTX *)local_270,pEVar3,local_2c8,local_360,uVar6,(ENGINE *)0x0
                           );
  local_3f8[0] = (internal)(iVar1 != 0);
  local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3f0;
    testing::Message::Message((Message *)&local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_358,(internal *)local_3f8,
               (AssertionResult *)
               "EVP_AEAD_CTX_init(ctx.get(), aead(), key, key_len, tag_len, __null )","false","true"
               ,pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_408,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x1ed,local_358._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_408,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    __ptr_00 = local_3f0;
    if (local_3d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3d8._M_head_impl + 8))();
      __ptr_00 = local_3f0;
    }
LAB_0022dd0b:
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0022dd7d;
  }
  else {
    local_409 = 0x41;
    local_40a = '*';
    local_358._M_dataplus._M_p = (pointer)0x2a2a2a2a2a2a2a2a;
    local_358._M_string_length._0_1_ = '*';
    local_358._M_string_length._1_1_ = '*';
    local_358._M_string_length._2_1_ = '*';
    local_358._M_string_length._3_1_ = '*';
    local_358._M_string_length._4_1_ = '*';
    local_358._M_string_length._5_1_ = '*';
    local_358._M_string_length._6_1_ = '*';
    local_358._M_string_length._7_1_ = '*';
    local_358.field_2._M_local_buf[0] = '*';
    local_358.field_2._M_local_buf[1] = '*';
    local_358.field_2._M_local_buf[2] = '*';
    local_358.field_2._M_local_buf[3] = '*';
    local_358.field_2._M_local_buf[4] = '*';
    local_358.field_2._M_local_buf[5] = '*';
    local_358.field_2._M_local_buf[6] = '*';
    local_358.field_2._M_local_buf[7] = '*';
    local_358.field_2._M_local_buf[8] = '*';
    local_358.field_2._M_local_buf[9] = '*';
    local_358.field_2._M_local_buf[10] = '*';
    local_358.field_2._M_local_buf[0xb] = '*';
    local_358.field_2._M_local_buf[0xc] = '*';
    local_358.field_2._M_local_buf[0xd] = '*';
    local_358.field_2._M_local_buf[0xe] = '*';
    local_358.field_2._M_local_buf[0xf] = '*';
    builtin_strncpy(local_338,
                    "************************************************************************************************"
                    ,0x60);
    pcVar8 = local_390;
    iVar1 = EVP_AEAD_CTX_seal((EVP_AEAD_CTX *)local_270,(uint8_t *)&local_358,&local_3a0,0x80,
                              (uint8_t *)&local_388,(size_t)local_390,&local_409,1,(uint8_t *)0x0,0)
    ;
    local_3d8._M_head_impl._0_1_ = iVar1 != 0;
    pbStack_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&pbStack_3d0;
      testing::Message::Message((Message *)auStack_408);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3f8,(internal *)&local_3d8,
                 (AssertionResult *)
                 "EVP_AEAD_CTX_seal(ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext), nonce, nonce_len, plaintext, sizeof(plaintext), nullptr , 0)"
                 ,"false","true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x1f8,(char *)CONCAT71(local_3f8._1_7_,local_3f8[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)auStack_408);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_3f8._1_7_,local_3f8[0]) != &local_3e8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_3f8._1_7_,local_3f8[0]),
                        local_3e8._M_allocated_capacity + 1);
      }
      __ptr_00 = pbStack_3d0;
      if (auStack_408 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auStack_408 + 8))();
        __ptr_00 = pbStack_3d0;
      }
      goto LAB_0022dd0b;
    }
    if (local_3a0 < 0x80) {
      uVar9 = local_3a0;
      do {
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  ((internal *)local_3f8,"kSentinel","ciphertext[i]",&local_40a,
                   (uchar *)((long)&local_358._M_dataplus._M_p + uVar9));
        if (local_3f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_3d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_3d8._M_head_impl + 0x10),
                     "Sealing wrote off the end of the buffer.",0x28);
          pcVar7 = "";
          if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar7 = (local_3f0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)auStack_408,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x1fc,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)auStack_408,(Message *)&local_3d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_408);
          if (local_3d8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_3d8._M_head_impl + 8))();
          }
        }
        if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_3f0,local_3f0);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x80);
    }
    local_368 = local_3a0 - 1;
    pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
    pEVar3 = (*pPVar2->func)();
    sVar4 = EVP_AEAD_max_overhead(pEVar3);
    pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
    pEVar3 = (*pPVar2->func)();
    sVar5 = EVP_AEAD_max_tag_len(pEVar3);
    local_2d0 = (sVar4 + uVar6) - sVar5;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_3f8,"overhead_used","expected_overhead",&local_368,&local_2d0);
    if (local_3f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_3d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_3d8._M_head_impl + 0x10),
                 "AEAD is probably ignoring request to truncate tags.",0x33);
      if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (local_3f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)auStack_408,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x203,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)auStack_408,(Message *)&local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_408);
      if (local_3d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_3d8._M_head_impl + 8))();
      }
    }
    if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3f0,local_3f0);
    }
    local_3d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x2a2a2a2a2a2a2a2a;
    pbStack_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0x2a2a2a2a2a2a2a2a;
    local_3c8 = 0x2a;
    pcVar8 = local_390;
    iVar1 = EVP_AEAD_CTX_open((EVP_AEAD_CTX *)local_270,(uint8_t *)&local_3d8,&local_398,0x11,
                              (uint8_t *)&local_388,(size_t)local_390,(uint8_t *)&local_358,
                              local_3a0,(uint8_t *)0x0,0);
    auStack_408[0] = iVar1 != 0;
    local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_400;
      testing::Message::Message((Message *)&local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_3b8.span_.data_ + 0x10),
                 "Opening with truncated tag didn\'t work.",0x27);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3f8,(internal *)auStack_408,
                 (AssertionResult *)
                 "EVP_AEAD_CTX_open( ctx.get(), plaintext2, &plaintext2_len, sizeof(plaintext2), nonce, nonce_len, ciphertext, ciphertext_len, nullptr , 0)"
                 ,"false","true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x20c,(char *)CONCAT71(local_3f8._1_7_,local_3f8[0]));
      testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b8);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_3f8._1_7_,local_3f8[0]) != &local_3e8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_3f8._1_7_,local_3f8[0]),
                        local_3e8._M_allocated_capacity + 1);
      }
      __ptr_00 = local_400;
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           *)local_3b8.span_.data_ !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           *)0x0) {
        (**(code **)(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      local_3b8.span_.data_ + 8))();
        __ptr_00 = local_400;
      }
      goto LAB_0022dd0b;
    }
    if (local_398 < 0x11) {
      uVar6 = local_398;
      do {
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  ((internal *)local_3f8,"kSentinel","plaintext2[i]",&local_40a,
                   (uchar *)((long)&local_3d8._M_head_impl + uVar6));
        if (local_3f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)auStack_408);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)auStack_408 + 0x10),
                     "Opening wrote off the end of the buffer.",0x28);
          pcVar7 = "";
          if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar7 = (local_3f0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_3b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x211,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_3b8,(Message *)auStack_408);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
          if (auStack_408 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)auStack_408 + 8))();
          }
        }
        if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_3f0,local_3f0);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x11);
    }
    auStack_408 = (undefined1  [8])&local_409;
    local_3b8.span_.data_ = (uchar *)&local_3d8;
    local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_3f8,"Bytes(plaintext)","Bytes(plaintext2, plaintext2_len)",
               (Bytes *)auStack_408,&local_3b8);
    if (local_3f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)auStack_408);
      if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (local_3f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x215,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)auStack_408);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
      if (auStack_408 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auStack_408 + 8))();
      }
    }
    if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0022dd7d;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3f0;
    __ptr_00 = local_3f0;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,__ptr_00);
LAB_0022dd7d:
  EVP_AEAD_CTX_cleanup((EVP_AEAD_CTX *)local_270);
  return;
}

Assistant:

TEST_P(PerAEADTest, TruncatedTags) {
  if (!(GetParam().flags & kCanTruncateTags)) {
    return;
  }

  uint8_t key[EVP_AEAD_MAX_KEY_LENGTH];
  OPENSSL_memset(key, 0, sizeof(key));
  const size_t key_len = EVP_AEAD_key_length(aead());
  ASSERT_GE(sizeof(key), key_len);

  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH];
  OPENSSL_memset(nonce, 0, sizeof(nonce));
  const size_t nonce_len = EVP_AEAD_nonce_length(aead());
  ASSERT_GE(sizeof(nonce), nonce_len);

  const size_t tag_len = MinimumTagLength(GetParam().flags);
  bssl::ScopedEVP_AEAD_CTX ctx;
  ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), aead(), key, key_len, tag_len,
                                NULL /* ENGINE */));

  const uint8_t plaintext[1] = {'A'};

  uint8_t ciphertext[128];
  size_t ciphertext_len;
  constexpr uint8_t kSentinel = 42;
  OPENSSL_memset(ciphertext, kSentinel, sizeof(ciphertext));

  ASSERT_TRUE(EVP_AEAD_CTX_seal(ctx.get(), ciphertext, &ciphertext_len,
                                sizeof(ciphertext), nonce, nonce_len, plaintext,
                                sizeof(plaintext), nullptr /* ad */, 0));

  for (size_t i = ciphertext_len; i < sizeof(ciphertext); i++) {
    // Sealing must not write past where it said it did.
    EXPECT_EQ(kSentinel, ciphertext[i])
        << "Sealing wrote off the end of the buffer.";
  }

  const size_t overhead_used = ciphertext_len - sizeof(plaintext);
  const size_t expected_overhead =
      tag_len + EVP_AEAD_max_overhead(aead()) - EVP_AEAD_max_tag_len(aead());
  EXPECT_EQ(overhead_used, expected_overhead)
      << "AEAD is probably ignoring request to truncate tags.";

  uint8_t plaintext2[sizeof(plaintext) + 16];
  OPENSSL_memset(plaintext2, kSentinel, sizeof(plaintext2));

  size_t plaintext2_len;
  ASSERT_TRUE(EVP_AEAD_CTX_open(
      ctx.get(), plaintext2, &plaintext2_len, sizeof(plaintext2), nonce,
      nonce_len, ciphertext, ciphertext_len, nullptr /* ad */, 0))
      << "Opening with truncated tag didn't work.";

  for (size_t i = plaintext2_len; i < sizeof(plaintext2); i++) {
    // Likewise, opening should also stay within bounds.
    EXPECT_EQ(kSentinel, plaintext2[i])
        << "Opening wrote off the end of the buffer.";
  }

  EXPECT_EQ(Bytes(plaintext), Bytes(plaintext2, plaintext2_len));
}